

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::TestCase79::run(TestCase79 *this)

{
  bool bVar1;
  bool local_4b9;
  undefined1 local_4b8 [7];
  bool _kj_shouldLog_29;
  StringPtr local_4a8;
  bool local_491;
  undefined1 local_490 [7];
  bool _kj_shouldLog_28;
  StringPtr local_480;
  bool local_469;
  undefined1 local_468 [7];
  bool _kj_shouldLog_27;
  StringPtr local_458;
  bool local_441;
  undefined1 local_440 [7];
  bool _kj_shouldLog_26;
  StringPtr local_430;
  bool local_419;
  undefined1 local_418 [7];
  bool _kj_shouldLog_25;
  StringPtr local_408;
  bool local_3f1;
  undefined1 local_3f0 [7];
  bool _kj_shouldLog_24;
  StringPtr local_3e0;
  bool local_3c9;
  undefined1 local_3c8 [7];
  bool _kj_shouldLog_23;
  StringPtr local_3b8;
  bool local_3a1;
  undefined1 local_3a0 [7];
  bool _kj_shouldLog_22;
  StringPtr local_390;
  bool local_379;
  undefined1 local_378 [7];
  bool _kj_shouldLog_21;
  StringPtr local_368;
  bool local_351;
  undefined1 local_350 [7];
  bool _kj_shouldLog_20;
  StringPtr local_340;
  bool local_329;
  undefined1 local_328 [7];
  bool _kj_shouldLog_19;
  StringPtr local_318;
  bool local_301;
  undefined1 local_300 [7];
  bool _kj_shouldLog_18;
  StringPtr local_2f0;
  bool local_2d9;
  undefined1 local_2d8 [7];
  bool _kj_shouldLog_17;
  StringPtr local_2c8;
  bool local_2b1;
  undefined1 local_2b0 [7];
  bool _kj_shouldLog_16;
  StringPtr local_2a0;
  bool local_289;
  undefined1 local_288 [7];
  bool _kj_shouldLog_15;
  StringPtr local_278;
  bool local_261;
  undefined1 local_260 [7];
  bool _kj_shouldLog_14;
  StringPtr local_250;
  bool local_239;
  undefined1 local_238 [7];
  bool _kj_shouldLog_13;
  StringPtr local_228;
  bool local_211;
  undefined1 local_210 [7];
  bool _kj_shouldLog_12;
  StringPtr local_200;
  bool local_1e9;
  undefined1 local_1e8 [7];
  bool _kj_shouldLog_11;
  StringPtr local_1d8;
  bool local_1c1;
  undefined1 local_1c0 [7];
  bool _kj_shouldLog_10;
  StringPtr local_1b0;
  bool local_199;
  undefined1 local_198 [7];
  bool _kj_shouldLog_9;
  StringPtr local_188;
  bool local_171;
  undefined1 local_170 [7];
  bool _kj_shouldLog_8;
  StringPtr local_160;
  bool local_149;
  undefined1 local_148 [7];
  bool _kj_shouldLog_7;
  StringPtr local_138;
  bool local_121;
  undefined1 local_120 [7];
  bool _kj_shouldLog_6;
  StringPtr local_110;
  bool local_f9;
  undefined1 local_f8 [7];
  bool _kj_shouldLog_5;
  StringPtr local_e8;
  bool local_d1;
  undefined1 local_d0 [7];
  bool _kj_shouldLog_4;
  StringPtr local_c0;
  bool local_a9;
  undefined1 local_a8 [7];
  bool _kj_shouldLog_3;
  StringPtr local_98;
  bool local_81;
  undefined1 local_80 [7];
  bool _kj_shouldLog_2;
  StringPtr local_70;
  bool local_59;
  undefined1 local_58 [7];
  bool _kj_shouldLog_1;
  StringPtr local_48;
  bool local_31;
  undefined1 local_30 [7];
  bool _kj_shouldLog;
  StringPtr local_20;
  TestCase79 *local_10;
  TestCase79 *this_local;
  
  local_10 = this;
  Text::Reader::Reader((Reader *)&local_20,"foo");
  Text::Reader::Reader((Reader *)local_30,"foo");
  bVar1 = kj::StringPtr::operator==(&local_20,(StringPtr *)local_30);
  if (!bVar1) {
    local_31 = kj::_::Debug::shouldLog(ERROR);
    while (local_31 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x50,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") == Text::Reader(\\\"foo\\\")\"",
                 (char (*) [60])"failed: expected Text::Reader(\"foo\") == Text::Reader(\"foo\")");
      local_31 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_48,"foo");
  Text::Reader::Reader((Reader *)local_58,"foo");
  bVar1 = kj::StringPtr::operator!=(&local_48,(StringPtr *)local_58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_59 = kj::_::Debug::shouldLog(ERROR);
    while (local_59 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x51,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") != Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [63])
                  "failed: expected !(Text::Reader(\"foo\") != Text::Reader(\"foo\"))");
      local_59 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_70,"foo");
  Text::Reader::Reader((Reader *)local_80,"foo");
  bVar1 = kj::StringPtr::operator<=(&local_70,(StringPtr *)local_80);
  if (!bVar1) {
    local_81 = kj::_::Debug::shouldLog(ERROR);
    while (local_81 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x52,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") <= Text::Reader(\\\"foo\\\")\"",
                 (char (*) [60])"failed: expected Text::Reader(\"foo\") <= Text::Reader(\"foo\")");
      local_81 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_98,"foo");
  Text::Reader::Reader((Reader *)local_a8,"foo");
  bVar1 = kj::StringPtr::operator>=(&local_98,(StringPtr *)local_a8);
  if (!bVar1) {
    local_a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_a9 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x53,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") >= Text::Reader(\\\"foo\\\")\"",
                 (char (*) [60])"failed: expected Text::Reader(\"foo\") >= Text::Reader(\"foo\")");
      local_a9 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_c0,"foo");
  Text::Reader::Reader((Reader *)local_d0,"foo");
  bVar1 = kj::StringPtr::operator<(&local_c0,(StringPtr *)local_d0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_d1 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x54,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") < Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [62])"failed: expected !(Text::Reader(\"foo\") < Text::Reader(\"foo\"))"
                );
      local_d1 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_e8,"foo");
  Text::Reader::Reader((Reader *)local_f8,"foo");
  bVar1 = kj::StringPtr::operator>(&local_e8,(StringPtr *)local_f8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_f9 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x55,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") > Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [62])"failed: expected !(Text::Reader(\"foo\") > Text::Reader(\"foo\"))"
                );
      local_f9 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_110,"foo");
  Text::Reader::Reader((Reader *)local_120,"bar");
  bVar1 = kj::StringPtr::operator==(&local_110,(StringPtr *)local_120);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_121 = kj::_::Debug::shouldLog(ERROR);
    while (local_121 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x57,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") == Text::Reader(\\\"bar\\\"))\""
                 ,(char (*) [63])
                  "failed: expected !(Text::Reader(\"foo\") == Text::Reader(\"bar\"))");
      local_121 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_138,"foo");
  Text::Reader::Reader((Reader *)local_148,"bar");
  bVar1 = kj::StringPtr::operator!=(&local_138,(StringPtr *)local_148);
  if (!bVar1) {
    local_149 = kj::_::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x58,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") != Text::Reader(\\\"bar\\\")\"",
                 (char (*) [60])"failed: expected Text::Reader(\"foo\") != Text::Reader(\"bar\")");
      local_149 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_160,"foo");
  Text::Reader::Reader((Reader *)local_170,"bar");
  bVar1 = kj::StringPtr::operator<=(&local_160,(StringPtr *)local_170);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_171 = kj::_::Debug::shouldLog(ERROR);
    while (local_171 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x59,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") <= Text::Reader(\\\"bar\\\"))\""
                 ,(char (*) [63])
                  "failed: expected !(Text::Reader(\"foo\") <= Text::Reader(\"bar\"))");
      local_171 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_188,"foo");
  Text::Reader::Reader((Reader *)local_198,"bar");
  bVar1 = kj::StringPtr::operator>=(&local_188,(StringPtr *)local_198);
  if (!bVar1) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x5a,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") >= Text::Reader(\\\"bar\\\")\"",
                 (char (*) [60])"failed: expected Text::Reader(\"foo\") >= Text::Reader(\"bar\")");
      local_199 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_1b0,"foo");
  Text::Reader::Reader((Reader *)local_1c0,"bar");
  bVar1 = kj::StringPtr::operator<(&local_1b0,(StringPtr *)local_1c0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x5b,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") < Text::Reader(\\\"bar\\\"))\""
                 ,(char (*) [62])"failed: expected !(Text::Reader(\"foo\") < Text::Reader(\"bar\"))"
                );
      local_1c1 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_1d8,"foo");
  Text::Reader::Reader((Reader *)local_1e8,"bar");
  bVar1 = kj::StringPtr::operator>(&local_1d8,(StringPtr *)local_1e8);
  if (!bVar1) {
    local_1e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e9 != false) {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x5c,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") > Text::Reader(\\\"bar\\\")\"",
                 (char (*) [59])"failed: expected Text::Reader(\"foo\") > Text::Reader(\"bar\")");
      local_1e9 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_200,"bar");
  Text::Reader::Reader((Reader *)local_210,"foo");
  bVar1 = kj::StringPtr::operator==(&local_200,(StringPtr *)local_210);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_211 = kj::_::Debug::shouldLog(ERROR);
    while (local_211 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x5e,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"bar\\\") == Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [63])
                  "failed: expected !(Text::Reader(\"bar\") == Text::Reader(\"foo\"))");
      local_211 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_228,"bar");
  Text::Reader::Reader((Reader *)local_238,"foo");
  bVar1 = kj::StringPtr::operator!=(&local_228,(StringPtr *)local_238);
  if (!bVar1) {
    local_239 = kj::_::Debug::shouldLog(ERROR);
    while (local_239 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x5f,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"bar\\\") != Text::Reader(\\\"foo\\\")\"",
                 (char (*) [60])"failed: expected Text::Reader(\"bar\") != Text::Reader(\"foo\")");
      local_239 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_250,"bar");
  Text::Reader::Reader((Reader *)local_260,"foo");
  bVar1 = kj::StringPtr::operator<=(&local_250,(StringPtr *)local_260);
  if (!bVar1) {
    local_261 = kj::_::Debug::shouldLog(ERROR);
    while (local_261 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x60,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"bar\\\") <= Text::Reader(\\\"foo\\\")\"",
                 (char (*) [60])"failed: expected Text::Reader(\"bar\") <= Text::Reader(\"foo\")");
      local_261 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_278,"bar");
  Text::Reader::Reader((Reader *)local_288,"foo");
  bVar1 = kj::StringPtr::operator>=(&local_278,(StringPtr *)local_288);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_289 = kj::_::Debug::shouldLog(ERROR);
    while (local_289 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x61,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"bar\\\") >= Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [63])
                  "failed: expected !(Text::Reader(\"bar\") >= Text::Reader(\"foo\"))");
      local_289 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_2a0,"bar");
  Text::Reader::Reader((Reader *)local_2b0,"foo");
  bVar1 = kj::StringPtr::operator<(&local_2a0,(StringPtr *)local_2b0);
  if (!bVar1) {
    local_2b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b1 != false) {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x62,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"bar\\\") < Text::Reader(\\\"foo\\\")\"",
                 (char (*) [59])"failed: expected Text::Reader(\"bar\") < Text::Reader(\"foo\")");
      local_2b1 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_2c8,"bar");
  Text::Reader::Reader((Reader *)local_2d8,"foo");
  bVar1 = kj::StringPtr::operator>(&local_2c8,(StringPtr *)local_2d8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_2d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d9 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,99,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"bar\\\") > Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [62])"failed: expected !(Text::Reader(\"bar\") > Text::Reader(\"foo\"))"
                );
      local_2d9 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_2f0,"foobar");
  Text::Reader::Reader((Reader *)local_300,"foo");
  bVar1 = kj::StringPtr::operator==(&local_2f0,(StringPtr *)local_300);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_301 = kj::_::Debug::shouldLog(ERROR);
    while (local_301 != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x65,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foobar\\\") == Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [66])
                  "failed: expected !(Text::Reader(\"foobar\") == Text::Reader(\"foo\"))");
      local_301 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_318,"foobar");
  Text::Reader::Reader((Reader *)local_328,"foo");
  bVar1 = kj::StringPtr::operator!=(&local_318,(StringPtr *)local_328);
  if (!bVar1) {
    local_329 = kj::_::Debug::shouldLog(ERROR);
    while (local_329 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x66,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foobar\\\") != Text::Reader(\\\"foo\\\")\""
                 ,(char (*) [63])
                  "failed: expected Text::Reader(\"foobar\") != Text::Reader(\"foo\")");
      local_329 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_340,"foobar");
  Text::Reader::Reader((Reader *)local_350,"foo");
  bVar1 = kj::StringPtr::operator<=(&local_340,(StringPtr *)local_350);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_351 = kj::_::Debug::shouldLog(ERROR);
    while (local_351 != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x67,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foobar\\\") <= Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [66])
                  "failed: expected !(Text::Reader(\"foobar\") <= Text::Reader(\"foo\"))");
      local_351 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_368,"foobar");
  Text::Reader::Reader((Reader *)local_378,"foo");
  bVar1 = kj::StringPtr::operator>=(&local_368,(StringPtr *)local_378);
  if (!bVar1) {
    local_379 = kj::_::Debug::shouldLog(ERROR);
    while (local_379 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x68,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foobar\\\") >= Text::Reader(\\\"foo\\\")\""
                 ,(char (*) [63])
                  "failed: expected Text::Reader(\"foobar\") >= Text::Reader(\"foo\")");
      local_379 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_390,"foobar");
  Text::Reader::Reader((Reader *)local_3a0,"foo");
  bVar1 = kj::StringPtr::operator<(&local_390,(StringPtr *)local_3a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_3a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3a1 != false) {
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x69,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foobar\\\") < Text::Reader(\\\"foo\\\"))\""
                 ,(char (*) [65])
                  "failed: expected !(Text::Reader(\"foobar\") < Text::Reader(\"foo\"))");
      local_3a1 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_3b8,"foobar");
  Text::Reader::Reader((Reader *)local_3c8,"foo");
  bVar1 = kj::StringPtr::operator>(&local_3b8,(StringPtr *)local_3c8);
  if (!bVar1) {
    local_3c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c9 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foobar\\\") > Text::Reader(\\\"foo\\\")\""
                 ,(char (*) [62])"failed: expected Text::Reader(\"foobar\") > Text::Reader(\"foo\")"
                );
      local_3c9 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_3e0,"foo");
  Text::Reader::Reader((Reader *)local_3f0,"foobar");
  bVar1 = kj::StringPtr::operator==(&local_3e0,(StringPtr *)local_3f0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_3f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3f1 != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x6c,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") == Text::Reader(\\\"foobar\\\"))\""
                 ,(char (*) [66])
                  "failed: expected !(Text::Reader(\"foo\") == Text::Reader(\"foobar\"))");
      local_3f1 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_408,"foo");
  Text::Reader::Reader((Reader *)local_418,"foobar");
  bVar1 = kj::StringPtr::operator!=(&local_408,(StringPtr *)local_418);
  if (!bVar1) {
    local_419 = kj::_::Debug::shouldLog(ERROR);
    while (local_419 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x6d,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") != Text::Reader(\\\"foobar\\\")\""
                 ,(char (*) [63])
                  "failed: expected Text::Reader(\"foo\") != Text::Reader(\"foobar\")");
      local_419 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_430,"foo");
  Text::Reader::Reader((Reader *)local_440,"foobar");
  bVar1 = kj::StringPtr::operator<=(&local_430,(StringPtr *)local_440);
  if (!bVar1) {
    local_441 = kj::_::Debug::shouldLog(ERROR);
    while (local_441 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x6e,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") <= Text::Reader(\\\"foobar\\\")\""
                 ,(char (*) [63])
                  "failed: expected Text::Reader(\"foo\") <= Text::Reader(\"foobar\")");
      local_441 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_458,"foo");
  Text::Reader::Reader((Reader *)local_468,"foobar");
  bVar1 = kj::StringPtr::operator>=(&local_458,(StringPtr *)local_468);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_469 = kj::_::Debug::shouldLog(ERROR);
    while (local_469 != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x6f,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") >= Text::Reader(\\\"foobar\\\"))\""
                 ,(char (*) [66])
                  "failed: expected !(Text::Reader(\"foo\") >= Text::Reader(\"foobar\"))");
      local_469 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_480,"foo");
  Text::Reader::Reader((Reader *)local_490,"foobar");
  bVar1 = kj::StringPtr::operator<(&local_480,(StringPtr *)local_490);
  if (!bVar1) {
    local_491 = kj::_::Debug::shouldLog(ERROR);
    while (local_491 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x70,ERROR,
                 "\"failed: expected \" \"Text::Reader(\\\"foo\\\") < Text::Reader(\\\"foobar\\\")\""
                 ,(char (*) [62])"failed: expected Text::Reader(\"foo\") < Text::Reader(\"foobar\")"
                );
      local_491 = false;
    }
  }
  Text::Reader::Reader((Reader *)&local_4a8,"foo");
  Text::Reader::Reader((Reader *)local_4b8,"foobar");
  bVar1 = kj::StringPtr::operator>(&local_4a8,(StringPtr *)local_4b8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_4b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4b9 != false) {
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                 ,0x71,ERROR,
                 "\"failed: expected \" \"!(Text::Reader(\\\"foo\\\") > Text::Reader(\\\"foobar\\\"))\""
                 ,(char (*) [65])
                  "failed: expected !(Text::Reader(\"foo\") > Text::Reader(\"foobar\"))");
      local_4b9 = false;
    }
  }
  return;
}

Assistant:

TEST(Blob, Compare) {
  EXPECT_TRUE (Text::Reader("foo") == Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foo") != Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foo") <= Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foo") >= Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foo") <  Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foo") >  Text::Reader("foo"));

  EXPECT_FALSE(Text::Reader("foo") == Text::Reader("bar"));
  EXPECT_TRUE (Text::Reader("foo") != Text::Reader("bar"));
  EXPECT_FALSE(Text::Reader("foo") <= Text::Reader("bar"));
  EXPECT_TRUE (Text::Reader("foo") >= Text::Reader("bar"));
  EXPECT_FALSE(Text::Reader("foo") <  Text::Reader("bar"));
  EXPECT_TRUE (Text::Reader("foo") >  Text::Reader("bar"));

  EXPECT_FALSE(Text::Reader("bar") == Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("bar") != Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("bar") <= Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("bar") >= Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("bar") <  Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("bar") >  Text::Reader("foo"));

  EXPECT_FALSE(Text::Reader("foobar") == Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foobar") != Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foobar") <= Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foobar") >= Text::Reader("foo"));
  EXPECT_FALSE(Text::Reader("foobar") <  Text::Reader("foo"));
  EXPECT_TRUE (Text::Reader("foobar") >  Text::Reader("foo"));

  EXPECT_FALSE(Text::Reader("foo") == Text::Reader("foobar"));
  EXPECT_TRUE (Text::Reader("foo") != Text::Reader("foobar"));
  EXPECT_TRUE (Text::Reader("foo") <= Text::Reader("foobar"));
  EXPECT_FALSE(Text::Reader("foo") >= Text::Reader("foobar"));
  EXPECT_TRUE (Text::Reader("foo") <  Text::Reader("foobar"));
  EXPECT_FALSE(Text::Reader("foo") >  Text::Reader("foobar"));
}